

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDeformer.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::BlendShape::BlendShape
          (BlendShape *this,uint64_t id,Element *element,Document *doc,string *name)

{
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  *__range2;
  pointer ppCVar1;
  BlendShapeChannel *bspc;
  _Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  local_58;
  BlendShape *local_40;
  BlendShapeChannel *local_38;
  
  Deformer::Deformer(&this->super_Deformer,id,element,doc,name);
  (this->super_Deformer).super_Object._vptr_Object = (_func_int **)&PTR__BlendShape_007e4d28;
  (this->blendShapeChannels).
  super__Vector_base<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->blendShapeChannels).
  super__Vector_base<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->blendShapeChannels).
  super__Vector_base<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = this;
  Document::GetConnectionsByDestinationSequenced
            ((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
              *)&local_58,doc,(this->super_Deformer).super_Object.id,"Deformer");
  std::
  vector<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
  ::reserve(&this->blendShapeChannels,
            (long)local_58._M_impl.super__Vector_impl_data._M_finish -
            (long)local_58._M_impl.super__Vector_impl_data._M_start >> 3);
  for (ppCVar1 = local_58._M_impl.super__Vector_impl_data._M_start;
      ppCVar1 != local_58._M_impl.super__Vector_impl_data._M_finish; ppCVar1 = ppCVar1 + 1) {
    local_38 = Util::ProcessSimpleConnection<Assimp::FBX::BlendShapeChannel>
                         (*ppCVar1,false,"BlendShapeChannel -> BlendShape",element,(char **)0x0);
    if (local_38 != (BlendShapeChannel *)0x0) {
      std::
      vector<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
      ::push_back(&this->blendShapeChannels,&local_38);
    }
  }
  std::
  _Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
  ~_Vector_base(&local_58);
  return;
}

Assistant:

BlendShape::BlendShape(uint64_t id, const Element& element, const Document& doc, const std::string& name)
    : Deformer(id, element, doc, name)
{
    const std::vector<const Connection*>& conns = doc.GetConnectionsByDestinationSequenced(ID(), "Deformer");
    blendShapeChannels.reserve(conns.size());
    for (const Connection* con : conns) {
        const BlendShapeChannel* const bspc = ProcessSimpleConnection<BlendShapeChannel>(*con, false, "BlendShapeChannel -> BlendShape", element);
        if (bspc) {
            blendShapeChannels.push_back(bspc);
            continue;
        }
    }
}